

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

_Bool qp_resize(priority_queue *qp,size_t size,_func_void_void_ptr *payload_free)

{
  ulong uVar1;
  priority_queue_element *ppVar2;
  size_t sVar3;
  long lVar4;
  
  if ((qp != (priority_queue *)0x0) && (uVar1 = qp->count, uVar1 <= qp->size)) {
    if (size >> 0x3c == 0) {
      if (payload_free != (_func_void_void_ptr *)0x0 && size < uVar1) {
        lVar4 = size << 4;
        for (sVar3 = size; sVar3 < uVar1; sVar3 = sVar3 + 1) {
          (*payload_free)(*(void **)((long)&qp->data->payload + lVar4));
          uVar1 = qp->count;
          lVar4 = lVar4 + 0x10;
        }
        qp->count = size;
      }
      ppVar2 = (priority_queue_element *)mem_realloc(qp->data,size << 4);
      qp->data = ppVar2;
      qp->size = size;
    }
    return size >> 0x3c != 0;
  }
  __assert_fail("qp && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-queue.c",
                0xe3,"_Bool qp_resize(struct priority_queue *, size_t, void (*)(void *))");
}

Assistant:

bool qp_resize(struct priority_queue *qp, size_t size,
		void (*payload_free)(void*))
{
	assert(qp && qp->count <= qp->size);
	if (size > SIZE_MAX / MAX(2, sizeof(struct priority_queue_element))) {
		return true;
	}
	if (size < qp->count && payload_free) {
		size_t i;

		for (i = size; i < qp->count; ++i) {
			(*payload_free)(qp->data[i].payload.p);
		}
		qp->count = size;
	}
	qp->data = mem_realloc(qp->data, size * sizeof(*qp->data));
	qp->size = size;
	return false;
}